

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall IR::Instr::InsertMultipleBefore(Instr *this,Instr *endInstr)

{
  Instr *local_20;
  Instr *startInstr;
  Instr *endInstr_local;
  Instr *this_local;
  
  local_20 = endInstr->m_prev;
  if (local_20 == (Instr *)0x0) {
    InsertBefore(this,endInstr);
  }
  else {
    for (; local_20->m_prev != (Instr *)0x0; local_20 = local_20->m_prev) {
    }
    InsertRangeBefore(this,local_20,endInstr);
  }
  return;
}

Assistant:

void
Instr::InsertMultipleBefore(Instr *endInstr)
{
    Instr *startInstr = endInstr->m_prev;

    if (startInstr) // more than one instruction to insert
    {
        while (startInstr->m_prev)
        {
            startInstr = startInstr->m_prev;
        }
        return this->InsertRangeBefore(startInstr, endInstr);
    }
    return this->InsertBefore(endInstr);
}